

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceMemoryBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceMemoryBase<Diligent::EngineVkImplTraits>::DvpVerifyResize
          (DeviceMemoryBase<Diligent::EngineVkImplTraits> *this,Uint64 NewSize)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  Uint64 NewSize_local;
  DeviceMemoryBase<Diligent::EngineVkImplTraits> *this_local;
  
  if (NewSize % (this->
                super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
                ).m_Desc.PageSize != 0) {
    msg.field_2._8_8_ = NewSize;
    FormatString<char[10],unsigned_long,char[41],unsigned_long,char[2]>
              ((string *)local_38,(Diligent *)"NewSize (",(char (*) [10])((long)&msg.field_2 + 8),
               (unsigned_long *)") must be  a multiple of the page size (",
               (char (*) [41])
               &(this->
                super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
                ).m_Desc.PageSize,(unsigned_long *)0xcabce5,(char (*) [2])local_38);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"DvpVerifyResize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceMemoryBase.hpp"
               ,0x54);
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void DvpVerifyResize(Uint64 NewSize) const
    {
        DEV_CHECK_ERR((NewSize % this->m_Desc.PageSize) == 0,
                      "NewSize (", NewSize, ") must be  a multiple of the page size (", this->m_Desc.PageSize, ")");
    }